

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O2

void __thiscall HPrimal::solvePhase2(HPrimal *this,HModel *ptr_model)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HModel *pHVar4;
  double dVar5;
  
  this->model = ptr_model;
  iVar3 = ptr_model->numRow;
  this->numCol = ptr_model->numCol;
  this->numRow = iVar3;
  this->numTot = ptr_model->numTot;
  puts(
      "************************************\nPerforming primal simplex iterations\n************************************"
      );
  iVar2 = this->numRow / 100;
  iVar3 = 900;
  if (iVar2 < 900) {
    iVar3 = iVar2;
  }
  this->limitUpdate = iVar3 + 100;
  this->countUpdate = 0;
  HVector::setup(&this->column,this->numRow);
  HVector::setup(&this->row_ep,this->numRow);
  HVector::setup(&this->row_ap,this->numCol);
  this->totalRebuildTime = 0.0;
  this->totalRebuilds = 0;
  this->row_epDensity = 0.0;
  this->columnDensity = 0.0;
  HModel::util_reportMessage(this->model,"primal-start");
  HTimer::getTime(&this->model->timer);
  do {
    primalRebuild(this);
    do {
      primalChooseColumn(this);
      if (this->columnIn == -1) {
        this->invertHint = 3;
        goto LAB_00135b21;
      }
      primalChooseRow(this);
      if (this->rowOut == -1) {
        this->invertHint = 4;
        goto LAB_00135b21;
      }
      primalUpdate(this);
      if (this->invertHint != 0) goto LAB_00135b21;
    } while (this->model->objective <= this->model->dblOption[5]);
    printf("HPrimal::solve_phase2: Objective = %g > %g = dblOption[DBLOPT_OBJ_UB]\n");
    this->model->problemStatus = 5;
LAB_00135b21:
    dVar1 = this->model->totalTime;
    dVar5 = HTimer::getTime(&this->model->timer);
    dVar5 = dVar5 + dVar1;
    pHVar4 = this->model;
    if (this->TimeLimitValue <= dVar5 && dVar5 != this->TimeLimitValue) {
      pHVar4->problemStatus = 6;
      return;
    }
    if (pHVar4->problemStatus == 5) {
      return;
    }
    if (pHVar4->mlFg_haveFreshRebuild != 0) {
      if (pHVar4->problemStatus - 5U < 2) {
        return;
      }
      if (this->columnIn == -1) {
        HModel::util_reportMessage(pHVar4,"primal-optimal");
        HModel::util_reportMessage(this->model,"problem-optimal");
        pHVar4 = this->model;
        iVar3 = 0;
      }
      else {
        HModel::util_reportMessage(pHVar4,"primal-unbounded");
        pHVar4 = this->model;
        iVar3 = 2;
      }
      HModel::setProblemStatus(pHVar4,iVar3);
      return;
    }
  } while( true );
}

Assistant:

void HPrimal::solvePhase2(HModel *ptr_model) {
    // Copy size
    model = ptr_model;
    numCol = model->getNumCol();
    numRow = model->getNumRow();
    numTot = model->getNumTot();

#ifdef JAJH_dev
    printf("************************************\nPerforming primal simplex iterations\n************************************\n");
#endif
    // Setup update limits
    limitUpdate = min(100 + numRow / 100, 1000);
    countUpdate = 0;

    // Setup local vectors
    column.setup(numRow);
    row_ep.setup(numRow);
    row_ap.setup(numCol);
    columnDensity = 0;
    row_epDensity = 0;

    // Initialise rebuild count and time
    totalRebuildTime = 0;
    totalRebuilds = 0;

    // Setup other buffers

    model->util_reportMessage("primal-start");

    double lc_totalTime = model->totalTime + model->timer.getTime();

    // Main solving structure
    for (;;) {
        primalRebuild();

        for (;;) {
            primalChooseColumn();
            if (columnIn == -1) {
	      invertHint = invertHint_possiblyOptimal; 
	      break;
	    }
            primalChooseRow();
            if (rowOut == -1) {
	      invertHint = invertHint_possiblyPrimalUnbounded;
	      break;
            }
            primalUpdate();
            if (invertHint) {
	      break;
	    }
	    //	    printf("HPrimal::solve_phase2: Iter = %d; Objective = %g\n", model->numberIteration, model->objective);
	    if (model->objective > model->dblOption[DBLOPT_OBJ_UB]) {
#ifdef SCIP_dev
	      printf("HPrimal::solve_phase2: Objective = %g > %g = dblOption[DBLOPT_OBJ_UB]\n", model->objective, model->dblOption[DBLOPT_OBJ_UB]);
#endif
	      model->problemStatus = LP_Status_ObjUB;
	      break;
	    }
        }

	lc_totalTime = model->totalTime + model->timer.getTime();
	//	printf("Primal Ph2: lc_totalTime = %5.2f\n", lc_totalTime);
	if (lc_totalTime > TimeLimitValue) {
	  model->problemStatus = LP_Status_OutOfTime;
	  break;
	}
	if (model->problemStatus == LP_Status_ObjUB) break;
	// If the data are fresh from rebuild(), break out of
	// the outer loop to see what's ocurred
	// Was:	if (countUpdate == 0) break;
	if (model->mlFg_haveFreshRebuild) break;
    }

    if (model->problemStatus == LP_Status_OutOfTime || model->problemStatus == LP_Status_ObjUB) return;

    if (columnIn == -1) {
        model->util_reportMessage("primal-optimal");
        model->util_reportMessage("problem-optimal");
        model->setProblemStatus(LP_Status_Optimal);
    } else {
        model->util_reportMessage("primal-unbounded");
        model->setProblemStatus(LP_Status_Unbounded);
    }
}